

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::detail::value_and_holder::set_instance_registered(value_and_holder *this,bool v)

{
  instance *piVar1;
  uint8_t *puVar2;
  byte bVar3;
  
  piVar1 = this->inst;
  if ((piVar1->field_0x30 & 2) == 0) {
    puVar2 = (piVar1->field_1).nonsimple.status;
    bVar3 = puVar2[this->index];
    if (v) {
      bVar3 = bVar3 | 2;
    }
    else {
      bVar3 = bVar3 & 0xfd;
    }
    puVar2[this->index] = bVar3;
    return;
  }
  piVar1->field_0x30 = piVar1->field_0x30 & 0xf7 | v << 3;
  return;
}

Assistant:

void set_instance_registered(bool v = true) {
        if (inst->simple_layout)
            inst->simple_instance_registered = v;
        else if (v)
            inst->nonsimple.status[index] |= instance::status_instance_registered;
        else
            inst->nonsimple.status[index] &= (uint8_t) ~instance::status_instance_registered;
    }